

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O2

void __thiscall EmitPrettyPrint::advanceleft(EmitPrettyPrint *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  TokenSplit *pTVar5;
  
  pTVar5 = (this->tokqueue).cache;
  uVar2 = (ulong)(this->tokqueue).left;
  uVar1 = uVar2;
  do {
    iVar4 = pTVar5[uVar1].size;
    if (iVar4 < 0) {
      return;
    }
    print(this,pTVar5 + (int)uVar2);
    if (pTVar5[(int)uVar2].delimtype == tokenstring) {
LAB_00322877:
      this->leftotal = this->leftotal + iVar4;
    }
    else if (pTVar5[(int)uVar2].delimtype == tokenbreak) {
      iVar4 = pTVar5[(int)uVar2].numspaces;
      goto LAB_00322877;
    }
    iVar4 = (this->tokqueue).max;
    uVar1 = (long)((this->tokqueue).left + 1) % (long)iVar4;
    uVar2 = uVar1 & 0xffffffff;
    iVar3 = (int)uVar1;
    (this->tokqueue).left = iVar3;
    if (iVar3 == ((this->tokqueue).right + 1) % iVar4) {
      return;
    }
    pTVar5 = (this->tokqueue).cache;
    uVar1 = (ulong)iVar3;
  } while( true );
}

Assistant:

void EmitPrettyPrint::advanceleft(void)

{
  int4 l = tokqueue.bottom().getSize();
  while(l >= 0) {
    const TokenSplit &tok( tokqueue.bottom() );
    print(tok);
    switch(tok.getClass()) {
    case TokenSplit::tokenbreak:
      leftotal += tok.getNumSpaces();
      break;
    case TokenSplit::tokenstring:
      leftotal += l;
      break;
    default:
      break;
    }
    tokqueue.popbottom();
    if (tokqueue.empty()) break;
    l = tokqueue.bottom().getSize();
  }
}